

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::CaptureNoImplicitCallUses
          (GlobOpt *this,Opnd *opnd,bool usesNoMissingValuesInfo,Instr *includeCurrentInstr)

{
  int iVar1;
  Func *func;
  List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00
  ;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  ValueType valueType_00;
  undefined8 in_RAX;
  undefined4 *puVar5;
  Opnd *this_01;
  PragmaInstr *instr;
  undefined8 uStack_38;
  ValueType valueType;
  
  uStack_38 = in_RAX;
  if (this->prePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3510,"(!IsLoopPrePass())","!IsLoopPrePass()");
    if (!bVar3) goto LAB_004514b4;
    *puVar5 = 0;
  }
  if (this->noImplicitCallUsesToInsert == (OpndList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3511,"(noImplicitCallUsesToInsert)","noImplicitCallUsesToInsert");
    if (!bVar3) goto LAB_004514b4;
    *puVar5 = 0;
  }
  if (opnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3512,"(opnd)","opnd");
    if (!bVar3) goto LAB_004514b4;
    *puVar5 = 0;
  }
  this_01 = IR::Opnd::Copy(opnd,this->func);
  if (!usesNoMissingValuesInfo) {
    uStack_38 = CONCAT26((this_01->m_valueType).field_0.bits,(undefined6)uStack_38);
    bVar3 = ValueType::IsArrayOrObjectWithArray((ValueType *)((long)&uStack_38 + 6));
    if (bVar3) {
      bVar3 = ValueType::HasNoMissingValues((ValueType *)((long)&uStack_38 + 6));
      if (bVar3) {
        valueType_00 = ValueType::SetHasNoMissingValues((ValueType *)((long)&uStack_38 + 6),false);
        IR::Opnd::SetValueType(this_01,valueType_00);
      }
    }
  }
  if (includeCurrentInstr == (Instr *)0x0) {
    this_00 = this->noImplicitCallUsesToInsert;
    JsUtil::
    List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    EnsureArray(this_00,0);
    iVar1 = (this_00->super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>).
            count;
    (this_00->super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>).buffer
    [iVar1] = this_01;
    (this_00->super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>).count =
         iVar1 + 1;
  }
  else {
    instr = IR::PragmaInstr::New(NoImplicitCallUses,0,includeCurrentInstr->m_func);
    if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_004514b4;
      *puVar5 = 0;
    }
    func = (instr->super_Instr).m_func;
    if (this_01->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) {
LAB_004514b4:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    bVar4 = this_01->field_0xb;
    if ((bVar4 & 2) != 0) {
      this_01 = IR::Opnd::Copy(this_01,func);
      bVar4 = this_01->field_0xb;
    }
    this_01->field_0xb = bVar4 | 2;
    (instr->super_Instr).m_src1 = this_01;
    IR::Opnd::SetIsJITOptimizedReg(this_01,true);
    IR::Instr::InsertAfter(includeCurrentInstr,&instr->super_Instr);
  }
  return;
}

Assistant:

void
GlobOpt::CaptureNoImplicitCallUses(
    IR::Opnd *opnd,
    const bool usesNoMissingValuesInfo,
    IR::Instr *const includeCurrentInstr)
{
    Assert(!IsLoopPrePass());
    Assert(noImplicitCallUsesToInsert);
    Assert(opnd);

    // The opnd may be deleted later, so make a copy to ensure it is alive for inserting NoImplicitCallUses later
    opnd = opnd->Copy(func);

    if(!usesNoMissingValuesInfo)
    {
        const ValueType valueType(opnd->GetValueType());
        if(valueType.IsArrayOrObjectWithArray() && valueType.HasNoMissingValues())
        {
            // Inserting NoImplicitCallUses for an opnd with a definitely-array-with-no-missing-values value type means that the
            // instruction following it uses the information that the array has no missing values in some way, for instance, it
            // may omit missing value checks. Based on that, the dead-store phase in turn ensures that the necessary bailouts
            // are inserted to ensure that the array still has no missing values until the following instruction. Since
            // 'usesNoMissingValuesInfo' is false, change the value type to indicate to the dead-store phase that the following
            // instruction does not use the no-missing-values information.
            opnd->SetValueType(valueType.SetHasNoMissingValues(false));
        }
    }

    if(includeCurrentInstr)
    {
        IR::Instr *const noImplicitCallUses =
            IR::PragmaInstr::New(Js::OpCode::NoImplicitCallUses, 0, includeCurrentInstr->m_func);
        noImplicitCallUses->SetSrc1(opnd);
        noImplicitCallUses->GetSrc1()->SetIsJITOptimizedReg(true);
        includeCurrentInstr->InsertAfter(noImplicitCallUses);
        return;
    }

    noImplicitCallUsesToInsert->Add(opnd);
}